

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>>,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::Tuple<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>>
          (PromiseDisposer *this,Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params,
          Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_> *params_1)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  void *pvVar2;
  
  pvVar2 = operator_new(0x400);
  AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
            ((AttachmentPromiseNodeBase *)((long)pvVar2 + 0x3b8),params);
  *(undefined ***)((long)pvVar2 + 0x3b8) = &PTR_destroy_006dac60;
  *(char **)((long)pvVar2 + 0x3d0) =
       (params_1->impl).super_TupleElement<0U,_kj::String>.value.content.ptr;
  *(size_t *)((long)pvVar2 + 0x3d8) =
       (params_1->impl).super_TupleElement<0U,_kj::String>.value.content.size_;
  (params_1->impl).super_TupleElement<0U,_kj::String>.value.content.ptr = (char *)0x0;
  (params_1->impl).super_TupleElement<0U,_kj::String>.value.content.size_ = 0;
  pAVar1 = (params_1->impl).super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.
           value.ptr;
  *(ArrayDisposer **)((long)pvVar2 + 0x3e0) =
       (params_1->impl).super_TupleElement<0U,_kj::String>.value.content.disposer;
  *(ArrayPtr<const_unsigned_char> **)((long)pvVar2 + 1000) = pAVar1;
  *(size_t *)((long)pvVar2 + 0x3f0) =
       (params_1->impl).super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value
       .size_;
  *(ArrayDisposer **)((long)pvVar2 + 0x3f8) =
       (params_1->impl).super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value
       .disposer;
  (params_1->impl).super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value.ptr
       = (ArrayPtr<const_unsigned_char> *)0x0;
  (params_1->impl).super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value.
  size_ = 0;
  *(void **)((long)pvVar2 + 0x3c0) = pvVar2;
  *(AttachmentPromiseNodeBase **)this = (AttachmentPromiseNodeBase *)((long)pvVar2 + 0x3b8);
  return (Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>,_kj::_::PromiseDisposer>
          )(AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>
            *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }